

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP4Writer::UpdateActiveFlag(BP4Writer *this,bool active)

{
  TransportMan *this_00;
  long lVar1;
  size_t i;
  ulong uVar2;
  char activeChar;
  
  this_00 = &this->m_FileMetadataIndexManager;
  transportman::TransportMan::WriteFileAt(this_00,&activeChar,1,0x26,-1);
  transportman::TransportMan::FlushFiles(this_00,-1);
  transportman::TransportMan::SeekToFileEnd(this_00,-1);
  if (this->m_DrainBB == true) {
    lVar1 = 0;
    for (uVar2 = 0;
        uVar2 < (ulong)((long)(this->m_MetadataIndexFileNames).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_MetadataIndexFileNames).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
      burstbuffer::FileDrainer::AddOperationWriteAt
                (&(this->m_FileDrainer).super_FileDrainer,
                 (string *)
                 ((long)&(((this->m_DrainMetadataIndexFileNames).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1),
                 0x26,1,&activeChar);
      burstbuffer::FileDrainer::AddOperationSeekEnd
                (&(this->m_FileDrainer).super_FileDrainer,
                 (string *)
                 ((long)&(((this->m_DrainMetadataIndexFileNames).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1));
      lVar1 = lVar1 + 0x20;
    }
  }
  return;
}

Assistant:

void BP4Writer::UpdateActiveFlag(const bool active)
{
    const char activeChar = (active ? '\1' : '\0');
    m_FileMetadataIndexManager.WriteFileAt(&activeChar, 1, m_BP4Serializer.m_ActiveFlagPosition);
    m_FileMetadataIndexManager.FlushFiles();
    m_FileMetadataIndexManager.SeekToFileEnd();
    if (m_DrainBB)
    {
        for (size_t i = 0; i < m_MetadataIndexFileNames.size(); ++i)
        {
            m_FileDrainer.AddOperationWriteAt(m_DrainMetadataIndexFileNames[i],
                                              m_BP4Serializer.m_ActiveFlagPosition, 1, &activeChar);
            m_FileDrainer.AddOperationSeekEnd(m_DrainMetadataIndexFileNames[i]);
        }
    }
}